

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

sexp type_exception(sexp ctx,sexp self,sexp str,sexp obj,sexp src)

{
  sexp psVar1;
  sexp_sint_t n;
  sexp sym;
  sexp res;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp local_68;
  sexp local_60;
  sexp_gc_var_t local_58;
  sexp_gc_var_t local_48;
  
  local_48.var = &local_60;
  local_60 = (sexp)0x43e;
  local_58.next = &local_48;
  local_58.var = &local_68;
  local_68 = (sexp)0x43e;
  local_48.next = (ctx->value).context.saves;
  (ctx->value).context.saves = local_58.next;
  (ctx->value).context.saves = &local_58;
  psVar1 = sexp_intern(ctx,"type",-1);
  local_68 = psVar1;
  local_60 = sexp_make_exception(ctx,psVar1,str,obj,self,(sexp)&DAT_0000003e);
  psVar1 = sexp_cons_op(ctx,psVar1,n,(local_60->value).type.slots,(sexp)&DAT_0000023e);
  (local_60->value).type.slots = psVar1;
  (ctx->value).context.saves = local_48.next;
  return local_60;
}

Assistant:

static sexp type_exception (sexp ctx, sexp self, sexp str, sexp obj, sexp src) {
  sexp_gc_var2(res, sym);
  sexp_gc_preserve2(ctx, res, sym);
  sym = sexp_intern(ctx, "type", -1);
  res = sexp_make_exception(ctx, sym, str, obj, self, src);
  sexp_exception_irritants(res)=sexp_list1(ctx, sexp_exception_irritants(res));
  sexp_gc_release2(ctx);
  return res;
}